

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinDeserializer<std::unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
     ::deserialize_elems<InputStream>
               (_Hashtable<int,std::pair<int_const,char>,std::allocator<std::pair<int_const,char>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *param_1,int param_2,undefined8 *param_3)

{
  T elem;
  undefined4 local_30;
  undefined1 local_2c [4];
  
  if (param_2 != 0) {
    do {
      local_30 = 0;
      local_2c[0] = 0;
      std::istream::read((char *)*param_3,(long)&local_30);
      std::istream::read((char *)*param_3,(long)local_2c);
      std::
      _Hashtable<int,std::pair<int_const,char>,std::allocator<std::pair<int_const,char>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<int,char>>(param_1,&local_30);
      param_2 = param_2 + -1;
    } while (param_2 != 0);
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::true_type  /* has insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    // map value_type is pair<const K, V>, we need pair<K, V>
    using T = deep_remove_const_t<typename Sequence::value_type>;

    while (size--)
    {
      T elem;
      mserialize::deserialize(elem, istream);
      s.insert(std::move(elem));
    }
  }